

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets_smart.cpp
# Opt level: O3

void remove_mean_from_signal(void)

{
  pointer pdVar1;
  iterator __end1;
  iterator __begin1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  int iVar8;
  undefined1 auVar7 [16];
  
  pdVar1 = v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar3 = (long)v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  iVar8 = (int)((long)v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x23);
  if (v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      dVar5 = dVar5 + v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
    auVar7._8_4_ = iVar8;
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = 0x45300000;
    m_s = dVar5 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
    pdVar2 = v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      do {
        *pdVar2 = *pdVar2 - m_s;
        pdVar2 = pdVar2 + 1;
      } while (pdVar2 != pdVar1);
    }
    return;
  }
  auVar6._8_4_ = iVar8;
  auVar6._0_8_ = lVar3;
  auVar6._12_4_ = 0x45300000;
  m_s = 0.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
  return;
}

Assistant:

void remove_mean_from_signal() {
	double Med = 0;
	for(size_t i = 0; i < v_s.size(); i++) {
		Med += v_s[i];
	}
	m_s = Med / double(v_s.size());
	for(auto &v : v_s)v -= m_s;
}